

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  undefined4 in_EAX;
  int iVar1;
  FILE *__stream;
  size_type __n;
  size_t sVar2;
  reference memory;
  undefined1 auVar3 [16];
  allocator local_79;
  char **local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  string local_50;
  
  auVar3._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar3._4_4_ = -(uint)(num_headers == (int *)0x0);
  auVar3._8_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  auVar3._12_4_ = -(uint)(filename == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  if (iVar1 == 0) {
    local_78 = err;
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::string((string *)&buf,filename,&local_79);
      std::operator+(&local_50,"Cannot read file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
      tinyexr::SetErrorMessage(&local_50,local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&buf);
      iVar1 = -7;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&buf,__n,(allocator_type *)&local_50);
      sVar2 = fread(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (sVar2 == __n) {
        memory = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        iVar1 = ParseEXRMultipartHeaderFromMemory
                          (exr_headers,num_headers,exr_version,memory,__n,local_78);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_50,"`fread\' error. file may be corrupted.",&local_79);
        tinyexr::SetErrorMessage(&local_50,local_78);
        std::__cxx11::string::~string((string *)&local_50);
        iVar1 = -5;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_50,"Invalid argument for ParseEXRMultipartHeaderFromFile()",
               (allocator *)&buf);
    tinyexr::SetErrorMessage(&local_50,err);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_INVALID_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      tinyexr::SetErrorMessage("`fread' error. file may be corrupted.", err);
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, &buf.at(0), filesize, err);
}